

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2.c
# Opt level: O0

void xmlSAX2EntityDecl(void *ctx,xmlChar *name,int type,xmlChar *publicId,xmlChar *systemId,
                      xmlChar *content)

{
  int iVar1;
  int local_64;
  xmlChar *pxStack_60;
  int i;
  char *base;
  xmlChar *URI;
  int res;
  int extSubset;
  xmlParserCtxtPtr ctxt;
  xmlEntityPtr ent;
  xmlChar *content_local;
  xmlChar *systemId_local;
  xmlChar *publicId_local;
  xmlChar *pxStack_18;
  int type_local;
  xmlChar *name_local;
  void *ctx_local;
  
  if ((ctx != (void *)0x0) && (*(long *)((long)ctx + 0x10) != 0)) {
    URI._4_4_ = (uint)(*(int *)((long)ctx + 0x150) == 2);
    _res = (xmlParserCtxtPtr)ctx;
    ent = (xmlEntityPtr)content;
    content_local = systemId;
    systemId_local = publicId;
    publicId_local._4_4_ = type;
    pxStack_18 = name;
    name_local = (xmlChar *)ctx;
    URI._0_4_ = xmlAddEntity(*(xmlDocPtr *)((long)ctx + 0x10),URI._4_4_,name,type,publicId,systemId,
                             content,(xmlEntityPtr *)&ctxt);
    if ((int)URI == 0) {
      if (((ctxt->node_seq).length == 0) && (content_local != (xmlChar *)0x0)) {
        pxStack_60 = (xmlChar *)0x0;
        local_64 = _res->inputNr;
        do {
          local_64 = local_64 + -1;
          if (local_64 < 0) goto LAB_0015cdb0;
        } while (_res->inputTab[local_64]->filename == (char *)0x0);
        pxStack_60 = (xmlChar *)_res->inputTab[local_64]->filename;
LAB_0015cdb0:
        if (pxStack_60 == (xmlChar *)0x0) {
          pxStack_60 = (xmlChar *)_res->directory;
        }
        URI._0_4_ = xmlBuildURISafe(content_local,pxStack_60,(xmlChar **)&base);
        if (base == (char *)0x0) {
          if ((int)URI < 0) {
            xmlSAX2ErrMemory(_res);
          }
          else {
            xmlWarnMsg(_res,XML_ERR_INVALID_URI,"Can\'t resolve URI: %s\n",content_local);
          }
        }
        else {
          iVar1 = xmlStrlen((xmlChar *)base);
          if (iVar1 < 0x7d1) {
            (ctxt->node_seq).length = (unsigned_long)base;
          }
          else {
            xmlFatalErr(_res,XML_ERR_RESOURCE_LIMIT,"URI too long");
            (*xmlFree)(base);
          }
        }
      }
    }
    else if ((int)URI == 2) {
      xmlSAX2ErrMemory(_res);
    }
    else if ((int)URI == 0x6b) {
      if (_res->pedantic != 0) {
        if (URI._4_4_ == 0) {
          xmlWarnMsg(_res,XML_WAR_ENTITY_REDEFINED,
                     "Entity(%s) already defined in the internal subset\n",pxStack_18);
        }
        else {
          xmlWarnMsg(_res,XML_WAR_ENTITY_REDEFINED,
                     "Entity(%s) already defined in the external subset\n",pxStack_18);
        }
      }
    }
    else if ((int)URI == 0x75) {
      xmlWarnMsg(_res,XML_ERR_REDECL_PREDEF_ENTITY,
                 "Invalid redeclaration of predefined entity \'%s\'",pxStack_18);
    }
    else {
      xmlFatalErrMsg(_res,XML_ERR_INTERNAL_ERROR,"Unexpected error code from xmlAddEntity\n",
                     (xmlChar *)0x0,(xmlChar *)0x0);
    }
  }
  return;
}

Assistant:

void
xmlSAX2EntityDecl(void *ctx, const xmlChar *name, int type,
          const xmlChar *publicId, const xmlChar *systemId, xmlChar *content)
{
    xmlEntityPtr ent;
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) ctx;
    int extSubset;
    int res;

    if ((ctxt == NULL) || (ctxt->myDoc == NULL))
        return;

    extSubset = ctxt->inSubset == 2;
    res = xmlAddEntity(ctxt->myDoc, extSubset, name, type, publicId, systemId,
                       content, &ent);
    switch (res) {
        case XML_ERR_OK:
            break;
        case XML_ERR_NO_MEMORY:
            xmlSAX2ErrMemory(ctxt);
            return;
        case XML_WAR_ENTITY_REDEFINED:
            if (ctxt->pedantic) {
                if (extSubset)
                    xmlWarnMsg(ctxt, res, "Entity(%s) already defined in the"
                               " external subset\n", name);
                else
                    xmlWarnMsg(ctxt, res, "Entity(%s) already defined in the"
                               " internal subset\n", name);
            }
            return;
        case XML_ERR_REDECL_PREDEF_ENTITY:
            /*
             * Technically an error but it's a common mistake to get double
             * escaping according to "4.6 Predefined Entities" wrong.
             */
            xmlWarnMsg(ctxt, res, "Invalid redeclaration of predefined"
                       " entity '%s'", name);
            return;
        default:
            xmlFatalErrMsg(ctxt, XML_ERR_INTERNAL_ERROR,
                           "Unexpected error code from xmlAddEntity\n",
                           NULL, NULL);
            return;
    }

    if ((ent->URI == NULL) && (systemId != NULL)) {
        xmlChar *URI;
        const char *base = NULL;
        int i;

        for (i = ctxt->inputNr - 1; i >= 0; i--) {
            if (ctxt->inputTab[i]->filename != NULL) {
                base = ctxt->inputTab[i]->filename;
                break;
            }
        }

        /*
         * We don't really need the 'directory' struct member, but some
         * users set it manually to a base URI for memory streams.
         */
        if (base == NULL)
            base = ctxt->directory;

        res = xmlBuildURISafe(systemId, (const xmlChar *) base, &URI);

        if (URI == NULL) {
            if (res < 0) {
                xmlSAX2ErrMemory(ctxt);
            } else {
                xmlWarnMsg(ctxt, XML_ERR_INVALID_URI,
                           "Can't resolve URI: %s\n", systemId);
            }
        } else if (xmlStrlen(URI) > XML_MAX_URI_LENGTH) {
            xmlFatalErr(ctxt, XML_ERR_RESOURCE_LIMIT, "URI too long");
            xmlFree(URI);
        } else {
            ent->URI = URI;
        }
    }
}